

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O3

VectorXd __thiscall CppCNN::flatten_layer(CppCNN *this,LayerValues *input)

{
  double *pdVar1;
  DenseStorage<double,__1,__1,__1,_0> *pDVar2;
  element_type *peVar3;
  double dVar4;
  long *in_RDX;
  long lVar5;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  DenseStorage<double,__1,__1,__1,_0> *other;
  VectorXd VVar11;
  MatrixXd c_value;
  DenseStorage<double,__1,__1,__1,_0> local_40;
  
  lVar5 = *in_RDX;
  lVar5 = (in_RDX[1] - lVar5 >> 3) * -0x5555555555555555 *
          *(long *)(lVar5 + 0x10) * *(long *)(lVar5 + 8);
  (this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
  super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
  super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (lVar5 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar5,lVar5,1);
  other = (DenseStorage<double,__1,__1,__1,_0> *)*in_RDX;
  pDVar2 = (DenseStorage<double,__1,__1,__1,_0> *)in_RDX[1];
  IVar6 = extraout_RDX;
  if (other != pDVar2) {
    uVar10 = 0;
    do {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_40,other);
      Eigen::internal::
      inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_40);
      lVar5 = other->m_cols * other->m_rows;
      if (lVar5 < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                      ,0x11d,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_40,lVar5,lVar5,1);
      uVar7 = local_40.m_cols * local_40.m_rows;
      peVar3 = (this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
               super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((long)uVar7 < 0 && peVar3 != (element_type *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                      ,0xb0,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                     );
      }
      if (((long)(uVar7 | uVar10) < 0) ||
         ((long)((long)(this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
                       super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi -
                uVar7) < (long)uVar10)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (local_40.m_cols != 1) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseBase.h"
                      ,0x101,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                     );
      }
      uVar7 = (long)&(peVar3->super_enable_shared_from_this<CppCNN>)._M_weak_this.
                     super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2> + uVar10 * 8;
      uVar8 = local_40.m_rows;
      if (((uVar7 & 7) == 0) &&
         (uVar8 = (ulong)((uint)(uVar7 >> 3) & 1), local_40.m_rows <= (long)uVar8)) {
        uVar8 = local_40.m_rows;
      }
      if (0 < (long)uVar8) {
        uVar9 = 0;
        do {
          *(double *)(uVar7 + uVar9 * 8) = local_40.m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      lVar5 = local_40.m_rows - uVar8;
      uVar9 = (lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
      if (1 < lVar5) {
        do {
          dVar4 = (local_40.m_data + uVar8)[1];
          pdVar1 = (double *)(uVar7 + uVar8 * 8);
          *pdVar1 = local_40.m_data[uVar8];
          pdVar1[1] = dVar4;
          uVar8 = uVar8 + 2;
        } while ((long)uVar8 < (long)uVar9);
      }
      if ((long)uVar9 < local_40.m_rows) {
        do {
          *(double *)(uVar7 + uVar9 * 8) = local_40.m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (local_40.m_rows != uVar9);
      }
      uVar10 = uVar10 + local_40.m_rows;
      free(local_40.m_data);
      other = other + 1;
      IVar6 = extraout_RDX_00;
    } while (other != pDVar2);
  }
  VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar6;
  VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd CppCNN::flatten_layer(const LayerValues& input) {
	VectorXd v_flatten(input[0].size() * input.size());
	Index start = 0;
	for (auto& c : input) {
		MatrixXd c_value = c;
		c_value.transposeInPlace();
		c_value.resize(c.size(), 1);
		v_flatten.segment(start, c_value.size())= c_value;
		start += c_value.size();
	}
	return v_flatten;
}